

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Status parse_utf16_hex(char *s,uint *result)

{
  char c;
  char c_00;
  char c_01;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  JSON_Status JVar5;
  
  JVar5 = -1;
  if ((((*s != '\0') && (c = s[1], c != '\0')) && (c_00 = s[2], c_00 != '\0')) &&
     (c_01 = s[3], c_01 != '\0')) {
    iVar1 = hex_char_to_int(*s);
    iVar2 = hex_char_to_int(c);
    iVar3 = hex_char_to_int(c_00);
    uVar4 = hex_char_to_int(c_01);
    if ((uVar4 != 0xffffffff && iVar3 != -1) && (iVar2 != -1 && iVar1 != -1)) {
      *result = iVar3 << 4 | uVar4 | iVar2 << 8 | iVar1 << 0xc;
      JVar5 = 0;
    }
  }
  return JVar5;
}

Assistant:

static JSON_Status parse_utf16_hex(const char *s, unsigned int *result) {
    int x1, x2, x3, x4;
    if (s[0] == '\0' || s[1] == '\0' || s[2] == '\0' || s[3] == '\0') {
        return JSONFailure;
    }
    x1 = hex_char_to_int(s[0]);
    x2 = hex_char_to_int(s[1]);
    x3 = hex_char_to_int(s[2]);
    x4 = hex_char_to_int(s[3]);
    if (x1 == -1 || x2 == -1 || x3 == -1 || x4 == -1) {
        return JSONFailure;
    }
    *result = (unsigned int)((x1 << 12) | (x2 << 8) | (x3 << 4) | x4);
    return JSONSuccess;
}